

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  SnapGeneratorVirtualScriptFunctionInfo *snapFuncInfo;
  JavascriptGeneratorFunction *ptr;
  
  snapFuncInfo = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorVirtualScriptFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)35>
                           (snpObject);
  DoAddtlValueInstantiation_SnapScriptFunctionInfoEx
            (&snapFuncInfo->super_SnapScriptFunctionInfo,(ScriptFunction *)obj,inflator);
  if (snapFuncInfo->realFunction != 0) {
    ptr = (JavascriptGeneratorFunction *)
          InflateMap::LookupObject(inflator,snapFuncInfo->realFunction);
    Memory::WriteBarrierPtr<Js::JavascriptGeneratorFunction>::WriteBarrierSet
              ((WriteBarrierPtr<Js::JavascriptGeneratorFunction> *)&obj[4].type,ptr);
    return;
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo(const SnapObject *snpObject, Js::RecyclableObject *obj, InflateMap *inflator)
        {
            Js::GeneratorVirtualScriptFunction* fobj = reinterpret_cast<Js::GeneratorVirtualScriptFunction*>(obj);
            SnapGeneratorVirtualScriptFunctionInfo *sgvsf = SnapObjectGetAddtlInfoAs<SnapGeneratorVirtualScriptFunctionInfo *, SnapObjectType::SnapGeneratorVirtualScriptFunction>(snpObject);

            // fill in all the details of the base class
            DoAddtlValueInstantiation_SnapScriptFunctionInfoEx(sgvsf, fobj, inflator);

            if(sgvsf->realFunction != TTD_INVALID_PTR_ID)
            {
                fobj->SetRealGeneratorFunction(reinterpret_cast<Js::JavascriptGeneratorFunction*>(inflator->LookupObject(sgvsf->realFunction)));
            }
        }